

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::GetterXsYs<long_long>,_ImPlot::TransformerLinLin>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::GetterXsYs<long_long>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  GetterXsYs<long_long> *pGVar5;
  GetterXsYs<long_long> *pGVar6;
  ImDrawVert *pIVar7;
  ImDrawIdx *pIVar8;
  ImVec2 IVar9;
  float fVar10;
  undefined1 auVar11 [12];
  int iVar12;
  long lVar13;
  long lVar14;
  ImDrawIdx IVar15;
  ushort uVar16;
  ImPlotContext *gp;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  double dVar24;
  ImVec2 IVar25;
  double dVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  undefined1 auVar38 [16];
  
  pGVar5 = this->Getter1;
  pGVar6 = this->Getter2;
  iVar12 = pGVar5->Count;
  iVar3 = this->Transformer->YAxis;
  iVar4 = pGVar6->Count;
  lVar13 = (long)(((pGVar5->Offset + prim + 1) % iVar12 + iVar12) % iVar12) * (long)pGVar5->Stride;
  IVar25 = GImPlot->PixelRange[iVar3].Min;
  dVar24 = (double)IVar25.x;
  dVar26 = (double)IVar25.y;
  dVar1 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  dVar2 = GImPlot->CurrentPlot->YAxis[iVar3].Range.Min;
  lVar14 = (long)(((prim + 1 + pGVar6->Offset) % iVar4 + iVar4) % iVar4) * (long)pGVar6->Stride;
  fVar22 = (float)(((double)*(long *)((long)pGVar5->Xs + lVar13) - dVar1) * GImPlot->Mx + dVar24);
  fVar23 = (float)(((double)*(long *)((long)pGVar5->Ys + lVar13) - dVar2) * GImPlot->My[iVar3] +
                  dVar26);
  IVar25.x = (float)(((double)*(long *)((long)pGVar6->Xs + lVar14) - dVar1) * GImPlot->Mx + dVar24);
  IVar25.y = (float)(((double)*(long *)((long)pGVar6->Ys + lVar14) - dVar2) * GImPlot->My[iVar3] +
                    dVar26);
  fVar10 = (this->P12).x;
  fVar27 = (this->P12).y;
  fVar29 = (this->P11).x;
  fVar30 = (this->P11).y;
  uVar20 = -(uint)(fVar30 < fVar27);
  fVar28 = (float)(~-(uint)(fVar10 <= fVar29) & (uint)fVar10 |
                  (uint)fVar29 & -(uint)(fVar10 <= fVar29));
  fVar31 = (float)(~-(uint)(fVar27 <= fVar30) & (uint)fVar27 |
                  (uint)fVar30 & -(uint)(fVar27 <= fVar30));
  fVar34 = (float)(~-(uint)(fVar29 < fVar10) & (uint)fVar10 |
                  (uint)fVar29 & -(uint)(fVar29 < fVar10));
  fVar42 = (float)(~uVar20 & (uint)fVar27 | (uint)fVar30 & uVar20);
  uVar17 = -(uint)(fVar22 <= fVar28);
  uVar18 = -(uint)(fVar23 <= fVar31);
  uVar19 = -(uint)(fVar34 < fVar22);
  uVar21 = -(uint)(fVar42 < fVar23);
  fVar28 = (float)(~uVar17 & (uint)fVar22 | (uint)fVar28 & uVar17);
  fVar31 = (float)(~uVar18 & (uint)fVar23 | (uint)fVar31 & uVar18);
  fVar34 = (float)(~uVar19 & (uint)fVar22 | (uint)fVar34 & uVar19);
  fVar42 = (float)(~uVar21 & (uint)fVar23 | (uint)fVar42 & uVar21);
  uVar17 = -(uint)(IVar25.x <= fVar28);
  uVar18 = -(uint)(IVar25.y <= fVar31);
  uVar19 = -(uint)(fVar34 < IVar25.x);
  uVar21 = -(uint)(fVar42 < IVar25.y);
  auVar33._0_4_ = (uint)fVar28 & uVar17;
  auVar33._4_4_ = (uint)fVar31 & uVar18;
  auVar33._8_4_ = (uint)fVar34 & uVar19;
  auVar33._12_4_ = (uint)fVar42 & uVar21;
  auVar39._0_4_ = ~uVar17 & (uint)IVar25.x;
  auVar39._4_4_ = ~uVar18 & (uint)IVar25.y;
  auVar39._8_4_ = ~uVar19 & (uint)IVar25.x;
  auVar39._12_4_ = ~uVar21 & (uint)IVar25.y;
  auVar39 = auVar39 | auVar33;
  fVar28 = (cull_rect->Min).y;
  auVar41._4_4_ = -(uint)(fVar28 < auVar39._4_4_);
  auVar41._0_4_ = -(uint)((cull_rect->Min).x < auVar39._0_4_);
  auVar11._4_8_ = auVar39._8_8_;
  auVar11._0_4_ = -(uint)(auVar39._4_4_ < fVar28);
  auVar40._0_8_ = auVar11._0_8_ << 0x20;
  auVar40._8_4_ = -(uint)(auVar39._8_4_ < (cull_rect->Max).x);
  auVar40._12_4_ = -(uint)(auVar39._12_4_ < (cull_rect->Max).y);
  auVar41._8_8_ = auVar40._8_8_;
  iVar12 = movmskps((int)cull_rect,auVar41);
  if (iVar12 == 0xf) {
    fVar31 = fVar23 * fVar29 - fVar30 * fVar22;
    fVar34 = IVar25.y * fVar10 - fVar27 * IVar25.x;
    fVar28 = fVar27 - IVar25.y;
    auVar35._4_4_ = fVar28;
    auVar35._0_4_ = fVar28;
    auVar35._8_4_ = fVar28;
    auVar35._12_4_ = fVar28;
    auVar36._4_12_ = auVar35._4_12_;
    auVar36._0_4_ = fVar28 * (fVar29 - fVar22) - (fVar30 - fVar23) * (fVar10 - IVar25.x);
    auVar32._0_4_ = fVar31 * (fVar10 - IVar25.x) - fVar34 * (fVar29 - fVar22);
    auVar32._4_4_ = fVar31 * fVar28 - fVar34 * (fVar30 - fVar23);
    auVar32._8_4_ = fVar23 * 0.0 - IVar25.y * 0.0;
    auVar32._12_4_ = fVar23 * 0.0 - IVar25.y * 0.0;
    auVar38._0_8_ = auVar36._0_8_;
    auVar38._8_4_ = fVar28;
    auVar38._12_4_ = fVar28;
    auVar37._8_8_ = auVar38._8_8_;
    auVar37._4_4_ = auVar36._0_4_;
    auVar37._0_4_ = auVar36._0_4_;
    auVar33 = divps(auVar32,auVar37);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7->col = this->Col;
    IVar9.y = fVar23;
    IVar9.x = fVar22;
    pIVar7[1].pos = IVar9;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[1].col = this->Col;
    pIVar7[2].pos = auVar33._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[2].col = this->Col;
    pIVar7[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[3].col = this->Col;
    pIVar7[4].pos = IVar25;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar7 = DrawList->_VtxWritePtr;
    pIVar7[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar7 + 5;
    uVar17 = DrawList->_VtxCurrentIdx;
    pIVar8 = DrawList->_IdxWritePtr;
    IVar15 = (ImDrawIdx)uVar17;
    *pIVar8 = IVar15;
    uVar16 = (byte)((byte)uVar20 & IVar25.y < fVar23 | -(fVar27 < fVar30) & -(fVar23 < IVar25.y)) &
             1;
    pIVar8[1] = IVar15 + uVar16 + 1;
    pIVar8[2] = IVar15 + 3;
    pIVar8[3] = IVar15 + 1;
    pIVar8[4] = (uVar16 ^ 3) + IVar15;
    pIVar8[5] = IVar15 + 4;
    DrawList->_IdxWritePtr = pIVar8 + 6;
    DrawList->_VtxCurrentIdx = uVar17 + 5;
  }
  (this->P11).x = fVar22;
  (this->P11).y = fVar23;
  (this->P12).x = IVar25.x;
  (this->P12).y = IVar25.y;
  return (char)iVar12 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }